

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_CHOICE.c
# Opt level: O0

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **struct_ptr,
                 char *opt_mname,void *buf_ptr,size_t size)

{
  undefined4 uVar1;
  int iVar2;
  char *in_RCX;
  long *in_RDX;
  long extraout_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  byte *in_R8;
  long in_R9;
  asn_dec_rval_t aVar3;
  size_t num_5;
  size_t num_4;
  size_t num_3;
  size_t num_2;
  size_t num_1;
  size_t num;
  void **memb_ptr2;
  void *memb_ptr;
  asn_dec_rval_t tmprval;
  asn_TYPE_member_t *elm;
  xer_check_tag_e tcv;
  ssize_t ch_size;
  pxer_chunk_type_e ch_type;
  int edx;
  ssize_t consumed_myself;
  asn_struct_ctx_t *ctx;
  void *st;
  char *xml_tag;
  asn_CHOICE_specifics_t *specs;
  asn_dec_rval_t rval;
  uint local_144;
  uint local_13c;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  uint uVar4;
  int in_stack_fffffffffffffed4;
  uint uVar5;
  void *in_stack_fffffffffffffed8;
  pxer_chunk_type_e *in_stack_fffffffffffffee0;
  ulong in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef4;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  uint local_100;
  uint local_f8;
  char *local_f0;
  undefined4 uStack_b4;
  long *local_a8;
  long local_a0;
  undefined8 local_98;
  long local_90;
  uint *local_88;
  xer_check_tag_e local_7c;
  ssize_t local_78;
  int local_70;
  int local_6c;
  size_t local_68;
  short *local_60;
  void *local_58;
  char *local_50;
  int *local_48;
  long local_40;
  byte *local_38;
  long *local_28;
  undefined8 *local_20;
  undefined8 local_18;
  uint local_10;
  size_t local_8;
  
  local_48 = (int *)in_RSI[0x13];
  local_f0 = in_RCX;
  if (in_RCX == (char *)0x0) {
    local_f0 = (char *)in_RSI[1];
  }
  local_50 = local_f0;
  local_58 = (void *)*in_RDX;
  local_68 = 0;
  local_100 = in_stack_fffffffffffffefc;
  local_40 = in_R9;
  local_38 = in_R8;
  local_20 = in_RSI;
  local_18 = in_RDI;
  if (local_58 == (void *)0x0) {
    local_28 = in_RDX;
    local_58 = calloc(1,(long)*local_48);
    *local_28 = (long)local_58;
    local_100 = in_stack_fffffffffffffefc;
    if (local_58 == (void *)0x0) {
      local_10 = 2;
      local_8 = local_68;
      goto LAB_00156876;
    }
  }
  local_60 = (short *)((long)local_58 + (long)local_48[1]);
  if ((*local_60 == 0) && (*local_50 == '\0')) {
    *local_60 = 1;
  }
  local_6c = (int)local_60[1];
LAB_00155e93:
  if (*local_60 < 5) {
    if (*local_60 == 2) {
      local_88 = (uint *)(local_20[0x11] + (long)local_6c * 0x40);
      if ((*local_88 & 1) == 0) {
        local_a0 = (long)local_58 + (long)(int)local_88[2];
        local_a8 = &local_a0;
      }
      else {
        local_a8 = (long *)((long)local_58 + (long)(int)local_88[2]);
      }
      uVar1 = (**(code **)(*(long *)(local_88 + 6) + 0x38))
                        (local_18,*(undefined8 *)(local_88 + 6),local_a8,
                         *(undefined8 *)(local_88 + 0xe),local_38,local_40);
      local_98 = CONCAT44(uStack_b4,uVar1);
      local_38 = local_38 + extraout_RDX;
      local_40 = local_40 - extraout_RDX;
      local_68 = extraout_RDX + local_68;
      local_90 = extraout_RDX;
      ASN_DEBUG("XER/CHOICE: itdf: [%s] code=%d",**(undefined8 **)(local_88 + 6),uVar1);
      if ((uint)local_98 != 0) {
        local_10 = (uint)local_98;
        local_8 = local_68;
        goto LAB_00156876;
      }
      _set_present_idx(local_58,local_48[2],local_48[3],local_6c + 1);
      *local_60 = 3;
    }
    if ((*local_60 == 3) && (*local_50 == '\0')) {
      *local_60 = 5;
      local_10 = 0;
      local_8 = local_68;
      goto LAB_00156876;
    }
    local_78 = xer_next_token((int *)CONCAT44(local_100,in_stack_fffffffffffffef8),
                              (void *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                              in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    if (local_78 == -1) {
      local_10 = 2;
      local_8 = local_68;
      goto LAB_00156876;
    }
    if (local_70 == 0) {
      local_10 = 1;
      local_8 = local_68;
      goto LAB_00156876;
    }
    if ((local_70 != 1) && (local_70 - 2U < 2)) goto LAB_001561a1;
    local_7c = xer_check_tag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                             (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (local_78 < 1) {
      local_f8 = 0x3f;
    }
    else {
      local_f8 = (uint)*local_38;
    }
    if (local_78 < 2) {
      local_100 = 0x3f;
    }
    else {
      local_100 = (uint)local_38[1];
    }
    if (local_78 < 3) {
      in_stack_fffffffffffffef4 = 0x3f;
    }
    else {
      in_stack_fffffffffffffef4 = (uint)local_38[2];
    }
    if (local_78 < 4) {
      in_stack_fffffffffffffef0 = 0x3f;
    }
    else {
      in_stack_fffffffffffffef0 = (uint)local_38[3];
    }
    in_stack_fffffffffffffef8 = in_stack_fffffffffffffef4;
    ASN_DEBUG("XER/CHOICE checked [%c%c%c%c] vs [%s], tcv=%d",(ulong)local_f8,(ulong)local_100,
              (ulong)in_stack_fffffffffffffef4,(ulong)in_stack_fffffffffffffef0,local_50,local_7c);
    if (*local_60 == 4) {
      ASN_DEBUG("skip_unknown(%d, %ld)",(ulong)local_7c,*(undefined8 *)(local_60 + 8));
      iVar2 = xer_skip_unknown(local_7c,(ber_tlv_len_t *)(local_60 + 8));
      in_stack_fffffffffffffee8 = (ulong)(iVar2 + 1);
      switch(in_stack_fffffffffffffee8) {
      case 0:
        *local_60 = 5;
        local_10 = 2;
        local_8 = local_68;
        goto LAB_00156876;
      case 2:
        *local_60 = 3;
      case 1:
        local_38 = local_38 + local_78;
        local_40 = local_40 - local_78;
        local_68 = local_78 + local_68;
        goto LAB_00155e93;
      case 3:
        *local_60 = 3;
      }
    }
    in_stack_fffffffffffffee0 = (pxer_chunk_type_e *)(ulong)(local_7c - XCT_OPENING);
    switch(in_stack_fffffffffffffee0) {
    case (pxer_chunk_type_e *)0x0:
      if (*local_60 != 0) goto switchD_0015645e_caseD_4;
      local_38 = local_38 + local_78;
      local_40 = local_40 - local_78;
      local_68 = local_78 + local_68;
      *local_60 = 1;
      goto LAB_00155e93;
    case (pxer_chunk_type_e *)0x1:
      if (*local_60 == 3) {
        local_8 = local_78 + local_68;
        *local_60 = 5;
        local_10 = 0;
        goto LAB_00156876;
      }
      break;
    case (pxer_chunk_type_e *)0x2:
      break;
    default:
      goto switchD_0015645e_caseD_3;
    case (pxer_chunk_type_e *)0x4:
    case (pxer_chunk_type_e *)0x6:
switchD_0015645e_caseD_4:
      if (*local_60 == 1) {
        local_6c = 0;
        while (local_6c < *(int *)(local_20 + 0x12)) {
          local_88 = (uint *)(local_20[0x11] + (long)local_6c * 0x40);
          local_7c = xer_check_tag(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,
                                   (char *)CONCAT44(in_stack_fffffffffffffecc,
                                                    in_stack_fffffffffffffec8));
          in_stack_fffffffffffffed8 = (void *)(ulong)(local_7c - XCT_OPENING);
          switch(in_stack_fffffffffffffed8) {
          case (void *)0x0:
          case (void *)0x2:
            local_60[1] = (short)local_6c;
            *local_60 = 2;
            goto LAB_0015667f;
          default:
            local_6c = *(int *)(local_20 + 0x12);
            goto LAB_0015667f;
          case (void *)0x4:
          case (void *)0x6:
            local_6c = local_6c + 1;
          }
        }
LAB_0015667f:
        if (local_6c != *(int *)(local_20 + 0x12)) goto LAB_00155e93;
        if (local_48[10] != -1) {
          ASN_DEBUG("Got anticipated extension");
          if ((local_7c & XCT_CLOSING) == XCT_BROKEN) {
            local_60[8] = 1;
            local_60[9] = 0;
            local_60[10] = 0;
            local_60[0xb] = 0;
            *local_60 = 4;
          }
          else {
            *local_60 = 3;
          }
          local_38 = local_38 + local_78;
          local_40 = local_40 - local_78;
          local_68 = local_78 + local_68;
          goto LAB_00155e93;
        }
switchD_0015645e_caseD_3:
      }
    }
    if (local_78 < 1) {
      uVar5 = 0x3f;
    }
    else {
      uVar5 = (uint)*local_38;
    }
    if (local_78 < 2) {
      uVar4 = 0x3f;
    }
    else {
      uVar4 = (uint)local_38[1];
    }
    if (local_78 < 3) {
      local_13c = 0x3f;
    }
    else {
      local_13c = (uint)local_38[2];
    }
    if (local_78 < 4) {
      local_144 = 0x3f;
    }
    else {
      local_144 = (uint)local_38[3];
    }
    ASN_DEBUG("Unexpected XML tag [%c%c%c%c] in CHOICE [%s] (ph=%d, tag=%s)",(ulong)uVar5,
              (ulong)uVar4,(ulong)local_13c,(ulong)local_144,*local_20,(int)*local_60,local_50);
  }
  *local_60 = 5;
  local_10 = 2;
  local_8 = local_68;
LAB_00156876:
  aVar3._4_4_ = 0;
  aVar3.code = local_10;
  aVar3.consumed = local_8;
  return aVar3;
LAB_001561a1:
  local_38 = local_38 + local_78;
  local_40 = local_40 - local_78;
  local_68 = local_78 + local_68;
  goto LAB_00155e93;
}

Assistant:

asn_dec_rval_t
CHOICE_decode_xer(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	void **struct_ptr, const char *opt_mname,
		const void *buf_ptr, size_t size) {
	/*
	 * Bring closer parts of structure description.
	 */
	asn_CHOICE_specifics_t *specs = (asn_CHOICE_specifics_t *)td->specifics;
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;

	/*
	 * Parts of the structure being constructed.
	 */
	void *st = *struct_ptr;	/* Target structure. */
	asn_struct_ctx_t *ctx;	/* Decoder context */

	asn_dec_rval_t rval;		/* Return value of a decoder */
	ssize_t consumed_myself = 0;	/* Consumed bytes from ptr */
	int edx;			/* Element index */

	/*
	 * Create the target structure if it is not present already.
	 */
	if(st == 0) {
		st = *struct_ptr = CALLOC(1, specs->struct_size);
		if(st == 0) RETURN(RC_FAIL);
	}

	/*
	 * Restore parsing context.
	 */
	ctx = (asn_struct_ctx_t *)((char *)st + specs->ctx_offset);
	if(ctx->phase == 0 && !*xml_tag)
		ctx->phase = 1;	/* Skip the outer tag checking phase */

	/*
	 * Phases of XER/XML processing:
	 * Phase 0: Check that the opening tag matches our expectations.
	 * Phase 1: Processing body and reacting on closing tag.
	 * Phase 2: Processing inner type.
	 * Phase 3: Only waiting for closing tag.
	 * Phase 4: Skipping unknown extensions.
	 * Phase 5: PHASED OUT
	 */
	for(edx = ctx->step; ctx->phase <= 4;) {
		pxer_chunk_type_e ch_type;	/* XER chunk type */
		ssize_t ch_size;		/* Chunk size */
		xer_check_tag_e tcv;		/* Tag check value */
		asn_TYPE_member_t *elm;

		/*
		 * Go inside the member.
		 */
		if(ctx->phase == 2) {
			asn_dec_rval_t tmprval;
			void *memb_ptr;		/* Pointer to the member */
			void **memb_ptr2;	/* Pointer to that pointer */

			elm = &td->elements[edx];

			if(elm->flags & ATF_POINTER) {
				/* Member is a pointer to another structure */
				memb_ptr2 = (void **)((char *)st
					+ elm->memb_offset);
			} else {
				memb_ptr = (char *)st + elm->memb_offset;
				memb_ptr2 = &memb_ptr;
			}

			/* Start/Continue decoding the inner member */
			tmprval = elm->type->xer_decoder(opt_codec_ctx,
					elm->type, memb_ptr2, elm->name,
					buf_ptr, size);
			XER_ADVANCE(tmprval.consumed);
			ASN_DEBUG("XER/CHOICE: itdf: [%s] code=%d",
				elm->type->name, tmprval.code);
			if(tmprval.code != RC_OK)
				RETURN(tmprval.code);
			assert(_fetch_present_idx(st,
				specs->pres_offset, specs->pres_size) == 0);
			/* Record what we've got */
			_set_present_idx(st,
				specs->pres_offset, specs->pres_size, edx + 1);
			ctx->phase = 3;
			/* Fall through */
		}

		/* No need to wait for closing tag; special mode. */
		if(ctx->phase == 3 && !*xml_tag) {
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		}

		/*
		 * Get the next part of the XML stream.
		 */
		ch_size = xer_next_token(&ctx->context, buf_ptr, size, &ch_type);
		if(ch_size == -1) {
            RETURN(RC_FAIL);
        } else {
			switch(ch_type) {
			case PXER_WMORE:
                RETURN(RC_WMORE);
			case PXER_COMMENT:	/* Got XML comment */
			case PXER_TEXT:		/* Ignore free-standing text */
				XER_ADVANCE(ch_size);	/* Skip silently */
				continue;
			case PXER_TAG:
				break;	/* Check the rest down there */
			}
		}

		tcv = xer_check_tag(buf_ptr, ch_size, xml_tag);
		ASN_DEBUG("XER/CHOICE checked [%c%c%c%c] vs [%s], tcv=%d",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
		xml_tag, tcv);

		/* Skip the extensions section */
		if(ctx->phase == 4) {
			ASN_DEBUG("skip_unknown(%d, %ld)",
				tcv, (long)ctx->left);
			switch(xer_skip_unknown(tcv, &ctx->left)) {
			case -1:
				ctx->phase = 5;
				RETURN(RC_FAIL);
				continue;
			case 1:
				ctx->phase = 3;
				/* Fall through */
			case 0:
				XER_ADVANCE(ch_size);
				continue;
			case 2:
				ctx->phase = 3;
				break;
			}
		}

		switch(tcv) {
		case XCT_BOTH:
			break;	/* No CHOICE? */
		case XCT_CLOSING:
			if(ctx->phase != 3)
				break;
			XER_ADVANCE(ch_size);
			ctx->phase = 5;	/* Phase out */
			RETURN(RC_OK);
		case XCT_OPENING:
			if(ctx->phase == 0) {
				XER_ADVANCE(ch_size);
				ctx->phase = 1;	/* Processing body phase */
				continue;
			}
			/* Fall through */
		case XCT_UNKNOWN_OP:
		case XCT_UNKNOWN_BO:

			if(ctx->phase != 1)
				break;	/* Really unexpected */

			/*
			 * Search which inner member corresponds to this tag.
			 */
			for(edx = 0; edx < td->elements_count; edx++) {
				elm = &td->elements[edx];
				tcv = xer_check_tag(buf_ptr,ch_size,elm->name);
				switch(tcv) {
				case XCT_BOTH:
				case XCT_OPENING:
					/*
					 * Process this member.
					 */
					ctx->step = edx;
					ctx->phase = 2;
					break;
				case XCT_UNKNOWN_OP:
				case XCT_UNKNOWN_BO:
					continue;
				default:
					edx = td->elements_count;
					break;	/* Phase out */
				}
				break;
			}
			if(edx != td->elements_count)
				continue;

			/* It is expected extension */
			if(specs->ext_start != -1) {
				ASN_DEBUG("Got anticipated extension");
				/*
				 * Check for (XCT_BOTH or XCT_UNKNOWN_BO)
				 * By using a mask. Only record a pure
				 * <opening> tags.
				 */
				if(tcv & XCT_CLOSING) {
					/* Found </extension> without body */
					ctx->phase = 3; /* Terminating */
				} else {
					ctx->left = 1;
					ctx->phase = 4; /* Skip ...'s */
				}
				XER_ADVANCE(ch_size);
				continue;
			}

			/* Fall through */
		default:
			break;
		}

		ASN_DEBUG("Unexpected XML tag [%c%c%c%c] in CHOICE [%s]"
			" (ph=%d, tag=%s)",
			ch_size>0?((const uint8_t *)buf_ptr)[0]:'?',
			ch_size>1?((const uint8_t *)buf_ptr)[1]:'?',
			ch_size>2?((const uint8_t *)buf_ptr)[2]:'?',
			ch_size>3?((const uint8_t *)buf_ptr)[3]:'?',
			td->name, ctx->phase, xml_tag);
		break;
	}

	ctx->phase = 5;	/* Phase out, just in case */
	RETURN(RC_FAIL);
}